

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_set.c
# Opt level: O2

int mpt_dispatch_set(mpt_dispatch *disp,uintptr_t id,mpt_event_handler_t cmd,void *arg)

{
  mpt_buffer *pmVar1;
  int iVar2;
  mpt_command *pmVar3;
  
  pmVar3 = mpt_command_get(&disp->_d,id);
  if (cmd == (mpt_event_handler_t)0x0) {
    if (pmVar3 != (mpt_command *)0x0) {
      pmVar1 = (disp->_d)._buf;
      (*pmVar3->cmd)(pmVar3->arg,(void *)0x0);
      pmVar3->cmd = (_func_int_void_ptr_void_ptr *)0x0;
      pmVar3->arg = (void *)0x0;
      return (int)(((long)pmVar3 + (-0x20 - (long)pmVar1)) / 0x18);
    }
  }
  else if (pmVar3 == (mpt_command *)0x0) {
    iVar2 = mpt_command_set(&disp->_d,id,(_func_int_void_ptr_void_ptr *)cmd,arg);
    return iVar2;
  }
  return -1;
}

Assistant:

extern int mpt_dispatch_set(MPT_STRUCT(dispatch) *disp, uintptr_t id, MPT_TYPE(event_handler) cmd, void *arg)
{
	MPT_STRUCT(command) *dst = mpt_command_get(&disp->_d, id);
	
	/* clear registration */
	if (!cmd) {
		int pos;
		if (!dst) {
			return MPT_ERROR(BadArgument);
		}
		pos = dst - ((MPT_STRUCT(command) *) (disp->_d._buf + 1));
		dst->cmd(dst->arg, 0);
		dst->cmd = 0;
		dst->arg = 0;
		return pos;
	}
	/* id already used */
	if (dst) {
		return MPT_ERROR(BadArgument);
	}
	/* register command */
	return mpt_command_set(&disp->_d, id, (int (*)()) cmd, arg);
}